

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int fwd_aa_tab_clear(jit_State *J,IRRef lim,IRRef ta)

{
  ushort uVar1;
  AliasRet AVar2;
  IRIns *pIVar3;
  IRIns *calls;
  IRRef ref;
  IRRef ta_local;
  IRRef lim_local;
  jit_State *J_local;
  
  uVar1 = J->chain[0x62];
  while( true ) {
    calls._4_4_ = (uint)uVar1;
    if (calls._4_4_ <= lim) {
      return 1;
    }
    pIVar3 = (J->cur).ir + calls._4_4_;
    if (((pIVar3->field_0).op2 == 0x22) &&
       ((ta == (pIVar3->field_0).op1 ||
        (AVar2 = aa_table(J,ta,(uint)(pIVar3->field_0).op1), AVar2 != ALIAS_NO)))) break;
    uVar1 = (pIVar3->field_0).prev;
  }
  return 0;
}

Assistant:

static int fwd_aa_tab_clear(jit_State *J, IRRef lim, IRRef ta)
{
  IRRef ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *calls = IR(ref);
    if (calls->op2 == IRCALL_lj_tab_clear &&
	(ta == calls->op1 || aa_table(J, ta, calls->op1) != ALIAS_NO))
      return 0;  /* Conflict. */
    ref = calls->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}